

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
::_insert_entry(Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                *this,ID_index rowIndex,iterator *position)

{
  undefined1 local_38 [16];
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
  *local_28;
  Entry *newEntry;
  iterator *position_local;
  Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
  *pIStack_10;
  ID_index rowIndex_local;
  Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
  *this_local;
  
  newEntry = (Entry *)position;
  position_local._4_4_ = rowIndex;
  pIStack_10 = this;
  local_28 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>
             ::construct<unsigned_int&,unsigned_int&>
                       ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>
                         *)this->entryPool_,(uint *)this,(uint *)((long)&position_local + 4));
  boost::intrusive::
  tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_true>
  ::tree_iterator((tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_true>
                   *)(local_38 + 8),(nonconst_iterator *)newEntry);
  boost::intrusive::
  set_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
  ::insert((set_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
            *)local_38,(const_iterator *)&this->column_,(reference)(local_38 + 8));
  Row_access<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
  ::insert_entry(&this->super_Row_access_option,position_local._4_4_,local_28);
  return;
}

Assistant:

inline void Intrusive_set_column<Master_matrix>::_insert_entry(ID_index rowIndex, const iterator& position)
{
  if constexpr (Master_matrix::Option_list::has_row_access) {
    Entry* newEntry = entryPool_->construct(RA_opt::columnIndex_, rowIndex);
    column_.insert(position, *newEntry);
    RA_opt::insert_entry(rowIndex, newEntry);
  } else {
    Entry* newEntry = entryPool_->construct(rowIndex);
    column_.insert(position, *newEntry);
  }
}